

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossy.c
# Opt level: O0

void test_even(void)

{
  long lVar1;
  int iVar2;
  quicly_state_t qVar3;
  uint uVar4;
  quicly_cid_plaintext_t *pqVar5;
  bool bVar6;
  ptls_iovec_t pVar7;
  size_t asStackY_1c0 [3];
  undefined8 uStack_1a0;
  quicly_context_t *local_198;
  quicly_cid_plaintext_t *local_190;
  long local_188;
  uint64_t local_180 [2];
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  uint8_t *local_168;
  size_t local_160;
  quicly_decoded_packet_t decoded;
  size_t num_packets;
  unsigned_long __vla_expr0;
  iovec raw;
  undefined1 auStack_a0 [4];
  quicly_address_t srcaddr;
  quicly_address_t destaddr;
  int ret;
  size_t num_received;
  size_t num_sent;
  loss_cond_t cond_up;
  loss_cond_t cond_down;
  quicly_loss_conf_t lossconf;
  
  cond_down.data.rand_.bits_avail = 0x100000080;
  lossconf.time_reordering_percentile = 0x42;
  lossconf.min_pto = 0;
  local_198 = &quic_ctx;
  quic_ctx.loss.time_reordering_percentile = 0x80;
  quic_ctx.loss.min_pto = 1;
  quic_ctx.loss.default_initial_rtt = 0x42;
  quic_ctx.loss.num_speculative_ptos = '\0';
  quic_ctx.loss._13_3_ = 0;
  uStack_1a0 = 0x12f9d5;
  init_cond_even((loss_cond_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  uStack_1a0 = 0x12f9de;
  init_cond_even((loss_cond_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  quic_now = 1;
  local_180[0] = (local_198->transport_params).max_udp_payload_size;
  lVar1 = -(local_180[0] + 0xf & 0xfffffffffffffff0);
  local_188 = (long)&local_198 + lVar1;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fa2f;
  local_190 = new_master_id();
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fa42;
  pVar7 = ptls_iovec_init((void *)0x0,0);
  local_168 = pVar7.base;
  *(uint8_t **)((long)asStackY_1c0 + lVar1 + 8) = local_168;
  local_160 = pVar7.len;
  *(size_t *)((long)asStackY_1c0 + lVar1 + 0x10) = local_160;
  *(undefined8 *)(&stack0xfffffffffffffe58 + lVar1) = 0;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0;
  *(undefined8 *)((long)asStackY_1c0 + lVar1) = 0x12faaa;
  iVar2 = quicly_connect(*(quicly_conn_t ***)((long)&cond_down + lVar1),
                         *(quicly_context_t **)((long)&cond_up + lVar1 + 0x18),
                         *(char **)((long)&cond_up + lVar1 + 0x10),
                         *(sockaddr **)((long)&cond_up + lVar1 + 8),
                         *(sockaddr **)((long)&cond_up + lVar1),
                         *(quicly_cid_plaintext_t **)((long)&num_sent + lVar1),
                         *(ptls_iovec_t *)((long)&cond_down + lVar1 + 0x10),
                         *(ptls_handshake_properties_t **)((long)&lossconf + lVar1),
                         *(quicly_transport_parameters_t **)((long)&lossconf + lVar1 + 8));
  destaddr._20_4_ = iVar2;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fad7;
  _ok((int)(ulong)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb4)
  ;
  decoded._is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET;
  decoded._132_4_ = 0;
  *(uint64_t *)(&stack0xfffffffffffffe58 + lVar1) = local_180[0];
  *(undefined8 *)((long)asStackY_1c0 + lVar1 + 0x10) = 0x12fb1d;
  iVar2 = quicly_send(*(quicly_conn_t **)((long)&decoded + lVar1 + 0x70),
                      *(quicly_address_t **)((long)&decoded + lVar1 + 0x68),
                      *(quicly_address_t **)((long)&decoded + lVar1 + 0x60),
                      *(iovec **)((long)&decoded + lVar1 + 0x58),
                      *(size_t **)((long)&decoded + lVar1 + 0x50),
                      *(void **)((long)&decoded + lVar1 + 0x48),
                      *(size_t *)((long)&decoded + lVar1 + 0x80));
  destaddr._20_4_ = iVar2;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fb4a;
  _ok((int)(ulong)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb7)
  ;
  bVar6 = decoded._128_8_ == 1;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fb74;
  _ok((int)(ulong)bVar6,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb8)
  ;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fb8c;
  decode_packets(*(quicly_decoded_packet_t **)(&stack0xfffffffffffffe90 + lVar1),
                 *(iovec **)((long)local_180 + lVar1 + 8),*(size_t *)((long)local_180 + lVar1));
  bVar6 = decoded._128_8_ == 1;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fbb6;
  _ok((int)(ulong)bVar6,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xba)
  ;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fbbb;
  pqVar5 = new_master_id();
  *(quicly_cid_plaintext_t **)(&stack0xfffffffffffffe58 + lVar1) = pqVar5;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0;
  *(undefined8 *)((long)asStackY_1c0 + lVar1 + 0x10) = 0x12fbf5;
  iVar2 = quicly_accept(*(quicly_conn_t ***)((long)&destaddr + lVar1),
                        *(quicly_context_t **)((long)&srcaddr + lVar1 + 0x14),
                        *(sockaddr **)((long)&srcaddr + lVar1 + 0xc),
                        *(sockaddr **)((long)&srcaddr + lVar1 + 4),
                        *(quicly_decoded_packet_t **)(auStack_a0 + lVar1),
                        *(quicly_address_token_plaintext_t **)(auStack_a0 + lVar1 + -8),
                        *(quicly_cid_plaintext_t **)((long)&destaddr + lVar1 + 0x10),
                        *(ptls_handshake_properties_t **)((long)&destaddr + lVar1 + 0x18));
  destaddr._20_4_ = iVar2;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fc22;
  _ok((int)(ulong)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xbc)
  ;
  *(undefined8 *)((long)&stack0xfffffffffffffe60 + lVar1) = 0x12fc29;
  (*(code *)num_sent)(&num_sent);
  asStackY_1c0[2] = 0x12fc63;
  destaddr._20_4_ =
       transmit_cond(server,client,&num_received,(size_t *)&destaddr.sin6.sin6_scope_id,
                     (loss_cond_t *)((long)&cond_up.data + 0x10),0,(ptls_buffer_t *)0x0);
  uStack_1a0 = 0x12fc90;
  _ok((int)(ulong)(destaddr._20_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc2)
  ;
  uStack_1a0 = 0x12fcb7;
  _ok((int)(ulong)(num_received == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc3)
  ;
  uStack_1a0 = 0x12fcde;
  _ok((int)(ulong)(stack0xffffffffffffff98 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc4)
  ;
  uStack_1a0 = 0x12fcea;
  qVar3 = quicly_get_state(client);
  uStack_1a0 = 0x12fd0f;
  _ok((int)(ulong)(qVar3 == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc5)
  ;
  uStack_1a0 = 0x12fd1b;
  iVar2 = quicly_connection_is_ready(client);
  uStack_1a0 = 0x12fd42;
  _ok((int)(ulong)((iVar2 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc6)
  ;
  quic_now = quic_now + 0x19;
  asStackY_1c0[2] = 0x12fd8a;
  destaddr._20_4_ =
       transmit_cond(client,server,&num_received,(size_t *)&destaddr.sin6.sin6_scope_id,
                     (loss_cond_t *)&num_sent,0,(ptls_buffer_t *)0x0);
  uStack_1a0 = 0x12fdb7;
  _ok((int)(ulong)(destaddr._20_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xcc)
  ;
  uStack_1a0 = 0x12fdde;
  _ok((int)(ulong)(num_received == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xcd)
  ;
  uStack_1a0 = 0x12fe05;
  _ok((int)(ulong)(stack0xffffffffffffff98 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xce)
  ;
  uStack_1a0 = 0x12fe11;
  qVar3 = quicly_get_state(client);
  uStack_1a0 = 0x12fe36;
  _ok((int)(ulong)(qVar3 == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd0)
  ;
  uStack_1a0 = 0x12fe42;
  iVar2 = quicly_connection_is_ready(client);
  uStack_1a0 = 0x12fe69;
  _ok((int)(ulong)((iVar2 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd1)
  ;
  quic_now = quic_now + 1000;
  asStackY_1c0[2] = 0x12feb4;
  destaddr._20_4_ =
       transmit_cond(server,client,&num_received,(size_t *)&destaddr.sin6.sin6_scope_id,
                     (loss_cond_t *)((long)&cond_up.data + 0x10),0,(ptls_buffer_t *)0x0);
  uStack_1a0 = 0x12fee1;
  _ok((int)(ulong)(destaddr._20_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd7)
  ;
  uStack_1a0 = 0x12ff08;
  _ok((int)(ulong)(num_received == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd8)
  ;
  uStack_1a0 = 0x12ff2f;
  _ok((int)(ulong)(stack0xffffffffffffff98 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd9)
  ;
  uStack_1a0 = 0x12ff3b;
  qVar3 = quicly_get_state(client);
  uStack_1a0 = 0x12ff60;
  _ok((int)(ulong)(qVar3 == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xda)
  ;
  uStack_1a0 = 0x12ff6c;
  iVar2 = quicly_connection_is_ready(client);
  uStack_1a0 = 0x12ff93;
  _ok((int)(ulong)((iVar2 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xdb)
  ;
  quic_now = quic_now + 0x19;
  asStackY_1c0[2] = 0x12ffdb;
  destaddr._20_4_ =
       transmit_cond(client,server,&num_received,(size_t *)&destaddr.sin6.sin6_scope_id,
                     (loss_cond_t *)&num_sent,0,(ptls_buffer_t *)0x0);
  uStack_1a0 = 0x130008;
  _ok((int)(ulong)(destaddr._20_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe1)
  ;
  uStack_1a0 = 0x13002f;
  _ok((int)(ulong)(num_received == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe2)
  ;
  uStack_1a0 = 0x130056;
  _ok((int)(ulong)(stack0xffffffffffffff98 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe3)
  ;
  quic_now = quic_now + 1000;
  asStackY_1c0[2] = 0x1300a1;
  destaddr._20_4_ =
       transmit_cond(server,client,&num_received,(size_t *)&destaddr.sin6.sin6_scope_id,
                     (loss_cond_t *)((long)&cond_up.data + 0x10),0,(ptls_buffer_t *)0x0);
  uStack_1a0 = 0x1300ce;
  _ok((int)(ulong)(destaddr._20_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe9)
  ;
  uStack_1a0 = 0x1300f5;
  _ok((int)(ulong)(num_received == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xea)
  ;
  uStack_1a0 = 0x13011c;
  _ok((int)(ulong)(stack0xffffffffffffff98 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xeb)
  ;
  uStack_1a0 = 0x130128;
  qVar3 = quicly_get_state(client);
  uStack_1a0 = 0x13014d;
  _ok((int)(ulong)(qVar3 == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xed)
  ;
  uStack_1a0 = 0x130159;
  uVar4 = quicly_connection_is_ready(client);
  uStack_1a0 = 0x130175;
  _ok((int)(ulong)uVar4,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xee)
  ;
  asStackY_1c0[2] = 0x1301a5;
  destaddr._20_4_ =
       transmit_cond(client,server,&num_received,(size_t *)&destaddr.sin6.sin6_scope_id,
                     (loss_cond_t *)&num_sent,0,(ptls_buffer_t *)0x0);
  uStack_1a0 = 0x1301d2;
  _ok((int)(ulong)(destaddr._20_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf2)
  ;
  uStack_1a0 = 0x1301f9;
  _ok((int)(ulong)(num_received == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf3)
  ;
  uStack_1a0 = 0x130220;
  _ok((int)(ulong)(stack0xffffffffffffff98 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf4)
  ;
  quic_now = quic_now + 1000;
  asStackY_1c0[2] = 0x13026b;
  destaddr._20_4_ =
       transmit_cond(server,client,&num_received,(size_t *)&destaddr.sin6.sin6_scope_id,
                     (loss_cond_t *)((long)&cond_up.data + 0x10),0,(ptls_buffer_t *)0x0);
  uStack_1a0 = 0x130298;
  _ok((int)(ulong)(destaddr._20_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfa)
  ;
  uStack_1a0 = 0x1302bf;
  _ok((int)(ulong)(num_received == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfb)
  ;
  uStack_1a0 = 0x1302e6;
  _ok((int)(ulong)(stack0xffffffffffffff98 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfc)
  ;
  quic_now = quic_now + 1000;
  asStackY_1c0[2] = 0x130331;
  destaddr._20_4_ =
       transmit_cond(client,server,&num_received,(size_t *)&destaddr.sin6.sin6_scope_id,
                     (loss_cond_t *)&num_sent,0,(ptls_buffer_t *)0x0);
  uStack_1a0 = 0x13035e;
  _ok((int)(ulong)(destaddr._20_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x102
     );
  uStack_1a0 = 0x130385;
  _ok((int)(ulong)(num_received == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x103
     );
  uStack_1a0 = 0x1303ac;
  _ok((int)(ulong)(stack0xffffffffffffff98 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x104
     );
  uStack_1a0 = 0x1303b8;
  qVar3 = quicly_get_state(server);
  uStack_1a0 = 0x1303dd;
  _ok((int)(ulong)(qVar3 == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x106
     );
  uStack_1a0 = 0x1303e9;
  uVar4 = quicly_connection_is_ready(server);
  uStack_1a0 = 0x130405;
  _ok((int)(ulong)uVar4,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x107
     );
  quic_ctx.loss.time_reordering_percentile = 0x80;
  quic_ctx.loss.min_pto = 1;
  quic_ctx.loss.default_initial_rtt = 0x42;
  quic_ctx.loss.num_speculative_ptos = (uint8_t)(in_stack_fffffffffffffe94 & 0xffffff00);
  quic_ctx.loss._13_3_ = (int3)((in_stack_fffffffffffffe94 & 0xffffff00) >> 8);
  return;
}

Assistant:

static void test_even(void)
{
    quicly_loss_conf_t lossconf = QUICLY_LOSS_SPEC_CONF;
    struct loss_cond_t cond_down, cond_up;
    size_t num_sent, num_received;
    int ret;

    quic_ctx.loss = lossconf;
    init_cond_even(&cond_down);
    init_cond_even(&cond_up);

    quic_now = 1;

    { /* transmit first flight */
        quicly_address_t destaddr, srcaddr;
        struct iovec raw;
        uint8_t rawbuf[quic_ctx.transport_params.max_udp_payload_size];
        size_t num_packets;
        quicly_decoded_packet_t decoded;

        ret = quicly_connect(&client, &quic_ctx, "example.com", &fake_address.sa, NULL, new_master_id(), ptls_iovec_init(NULL, 0),
                             NULL, NULL);
        ok(ret == 0);
        num_packets = 1;
        ret = quicly_send(client, &destaddr, &srcaddr, &raw, &num_packets, rawbuf, sizeof(rawbuf));
        ok(ret == 0);
        ok(num_packets == 1);
        decode_packets(&decoded, &raw, 1);
        ok(num_packets == 1);
        ret = quicly_accept(&server, &quic_ctx, NULL, &fake_address.sa, &decoded, NULL, new_master_id(), NULL);
        ok(ret == 0);
        cond_up.cb(&cond_up);
    }

    /* server sends 2 datagrams (Initial+Handshake,Handshake+1RTT), the latter gets dropped */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 2);
    ok(num_received == 1);
    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;

    /* client sends Handshake that gets dropped */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += 1000;

    /* server resends 2 datagrams, the latter gets dropped again */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 2);
    ok(num_received == 1);
    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;

    /* client sends Handshake again */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    quic_now += 1000;

    /* server retransmits the unacked (Handshake+1RTT) packet */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(quicly_connection_is_ready(client));

    /* client sends ClientFinished, gets lost */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    quic_now += 1000;

    /* server retransmits the unacked packet */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    quic_now += 1000;

    /* client resends ClientFinished */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    ok(quicly_get_state(server) == QUICLY_STATE_CONNECTED);
    ok(quicly_connection_is_ready(server));

    quic_ctx.loss = (quicly_loss_conf_t)QUICLY_LOSS_SPEC_CONF;
}